

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

Group * __thiscall
metaf::GroupParser::parseAlternative<10ul>
          (Group *__return_storage_ptr__,GroupParser *this,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata)

{
  undefined4 in_register_0000000c;
  optional<metaf::RunwayStateGroup> parsed;
  _Storage<metaf::RunwayStateGroup,_true> local_54;
  char local_2c;
  
  RunwayStateGroup::parse
            ((optional<metaf::RunwayStateGroup> *)&local_54._M_value,(string *)this,
             (ReportPart)group,(ReportMetadata *)CONCAT44(in_register_0000000c,reportPart));
  if (local_2c == '\x01') {
    *(SurfaceFriction *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ).
             super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ._M_u + 0x20) = local_54._M_value.sf;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ).
             super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ._M_u + 0x10) = local_54._16_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ).
             super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ._M_u + 0x18) = local_54._24_8_;
    *(Runway *)
     &(__return_storage_ptr__->
      super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      ).
      super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      ._M_u = local_54._M_value.rw;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ).
             super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ._M_u + 8) = local_54._8_8_;
    (__return_storage_ptr__->
    super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    ).
    super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    ._M_index = '\n';
  }
  else {
    parseAlternative<11ul>
              (__return_storage_ptr__,this,(string *)((ulong)group & 0xffffffff),reportPart,
               reportMetadata);
  }
  return __return_storage_ptr__;
}

Assistant:

static Group parseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
			if (parsed.has_value()) return *parsed;
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return parseAlternative<I+1>(group, reportPart, reportMetadata);
		}
	}